

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
logonAtLogonStartTimeFixture::logonAtLogonStartTimeFixture(logonAtLogonStartTimeFixture *this)

{
  UtcTimeOnly *this_00;
  UtcTimeOnly *this_01;
  int *piVar1;
  Session *pSVar2;
  TimeRange logonTime;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  Session local_58;
  DateTime local_50;
  DateTime local_38;
  
  anon_unknown.dwarf_334836::acceptorFixture::acceptorFixture(&this->super_acceptorFixture);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFixture_002fe298;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application = (_func_int **)&PTR__logonAtLogonStartTimeFixture_002fe2f0;
  FIX::UtcTimeStamp::setCurrent
            (&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now);
  this_00 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.
                  super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.
                super_DateTime.m_time + 4);
  FIX::DateTime::setMillisecond(&this_00->super_DateTime,0);
  this_01 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.
                  super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.
                super_DateTime.m_time + 4);
  FIX::DateTime::setMillisecond(&this_01->super_DateTime,0);
  piVar1 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime
            .m_date;
  FIX::DateTime::operator+=(&this_00->super_DateTime,-10);
  FIX::DateTime::operator+=(&this_01->super_DateTime,10);
  local_38.m_time =
       (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
       m_time;
  local_38._vptr_DateTime = (_func_int **)&PTR__DateTime_002f94c8;
  local_38._8_8_ = *(ulong *)piVar1 & 0xffffffff00000000;
  local_50.m_time =
       (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
       m_time;
  local_50._vptr_DateTime = (_func_int **)&PTR__DateTime_002f94c8;
  local_50._8_8_ = *(ulong *)piVar1 & 0xffffffff00000000;
  FIX::DateTime::operator+=(&local_38,1);
  FIX::DateTime::operator+=(&local_50,2);
  FIX::TimeRange::TimeRange(&logonTime,(UtcTimeOnly *)&local_38,(UtcTimeOnly *)&local_50,-1,-1);
  pSVar2 = (this->super_acceptorFixture).super_sessionFixture.object;
  *(undefined8 *)(pSVar2 + 0x1c8) = local_88;
  *(undefined8 *)(pSVar2 + 0x1d0) = uStack_80;
  *(undefined8 *)(pSVar2 + 0x1e0) = local_70;
  *(undefined8 *)(pSVar2 + 0x1e8) = uStack_68;
  pSVar2[0x1f8] = local_58;
  *(undefined8 *)(pSVar2 + 0x1f0) = local_60;
  return;
}

Assistant:

logonAtLogonStartTimeFixture() {
    now.setCurrent();
    startTime = now;
    startTime.setMillisecond(0);

    endTime = now;
    endTime.setMillisecond(0);

    startTime += -10;
    endTime += 10;

    UtcTimeOnly logonStartTime(now);
    UtcTimeOnly logonEndTime(now);
    logonStartTime += 1;
    logonEndTime += 2;
    TimeRange logonTime(logonStartTime, logonEndTime);

    object->setLogonTime(logonTime);
  }